

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

void Extra_Truth4VarN(unsigned_short **puCanons,char ***puPhases,char **ppCounters,int nPhasesMax)

{
  char cVar1;
  char *pcVar2;
  int v;
  unsigned_short *__ptr;
  char *__ptr_00;
  char **__ptr_01;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  ulong uVar8;
  
  __ptr = (unsigned_short *)calloc(1,0x20000);
  __ptr_00 = (char *)calloc(1,0x10000);
  __ptr_01 = (char **)Extra_ArrayAlloc(0x10000,nPhasesMax,1);
  uVar5 = 0;
  do {
    if ((ulong)__ptr[uVar5] == 0) {
      uVar6 = 0;
      do {
        puVar7 = Extra_TruthPolarize::Signs;
        lVar3 = 0;
        uVar8 = uVar5 & 0xffffffff;
        do {
          if ((uVar6 >> ((uint)lVar3 & 0x1f) & 1) != 0) {
            bVar4 = (byte)(1 << ((byte)lVar3 & 0x1f));
            uVar8 = (ulong)((*puVar7 & (uint)uVar8) >> (bVar4 & 0x1f) |
                           (~*puVar7 & (uint)uVar8) << (bVar4 & 0x1f));
          }
          lVar3 = lVar3 + 1;
          puVar7 = puVar7 + 1;
        } while (lVar3 != 4);
        if (((ulong)__ptr[uVar8] == 0) && (uVar5 != 0 || uVar6 == 0)) {
          __ptr[uVar8] = (unsigned_short)uVar5;
          *__ptr_01[uVar8] = (char)uVar6;
          __ptr_00[uVar8] = '\x01';
        }
        else {
          if (uVar5 != __ptr[uVar8]) {
            __assert_fail("uCanons[uPhase] == uTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                          ,0x351,"void Extra_Truth4VarN(unsigned short **, char ***, char **, int)")
            ;
          }
          cVar1 = __ptr_00[uVar8];
          if (cVar1 < nPhasesMax) {
            pcVar2 = __ptr_01[uVar8];
            __ptr_00[uVar8] = cVar1 + '\x01';
            pcVar2[(int)cVar1] = (char)uVar6;
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0x10);
    }
    else if (uVar5 <= __ptr[uVar5]) {
      __assert_fail("uTruth > uCanons[uTruth]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                    ,0x342,"void Extra_Truth4VarN(unsigned short **, char ***, char **, int)");
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x10000);
  if (puCanons == (unsigned_short **)0x0) {
    free(__ptr);
  }
  else {
    *puCanons = __ptr;
  }
  if (puPhases == (char ***)0x0) {
    if (__ptr_01 != (char **)0x0) {
      free(__ptr_01);
    }
  }
  else {
    *puPhases = __ptr_01;
  }
  if (ppCounters == (char **)0x0) {
    if (__ptr_00 != (char *)0x0) {
      free(__ptr_00);
      return;
    }
  }
  else {
    *ppCounters = __ptr_00;
  }
  return;
}

Assistant:

void Extra_Truth4VarN( unsigned short ** puCanons, char *** puPhases, char ** ppCounters, int nPhasesMax )
{
    unsigned short * uCanons;
    unsigned uTruth, uPhase;
    char ** uPhases, * pCounters;
    int nFuncs, nClasses, i;

    nFuncs  = (1 << 16);
    uCanons = ABC_ALLOC( unsigned short, nFuncs );
    memset( uCanons, 0, sizeof(unsigned short) * nFuncs );
    pCounters = ABC_ALLOC( char, nFuncs );
    memset( pCounters, 0, sizeof(char) * nFuncs );
    uPhases = (char **)Extra_ArrayAlloc( nFuncs, nPhasesMax, sizeof(char) );
    nClasses = 0;
    for ( uTruth = 0; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        if ( uCanons[uTruth] )
        {
            assert( uTruth > uCanons[uTruth] );
            continue;
        }
        nClasses++;
        for ( i = 0; i < 16; i++ )
        {
            uPhase = Extra_TruthPolarize( uTruth, i, 4 );
            if ( uCanons[uPhase] == 0 && (uTruth || i==0) )
            {
                uCanons[uPhase]    = uTruth;
                uPhases[uPhase][0] = i;
                pCounters[uPhase]  = 1;
            }
            else
            {
                assert( uCanons[uPhase] == uTruth );
                if ( pCounters[uPhase] < nPhasesMax )
                    uPhases[uPhase][ (int)pCounters[uPhase]++ ] = i;
            }
        }
    }
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( ppCounters ) 
        *ppCounters = pCounters;
    else
        ABC_FREE( pCounters );
//    printf( "The number of 4N-classes = %d.\n", nClasses );
}